

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.cpp
# Opt level: O1

void vera::rect(float _x,float _y,float _w,float _h,Shader *_program)

{
  initializer_list<glm::vec<2,_float,_(glm::qualifier)0>_> __l;
  initializer_list<glm::vec<2,_float,_(glm::qualifier)0>_> __l_00;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  tris;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  coorners;
  allocator_type local_79;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  local_78;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  local_60;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_48;
  float fStack_44;
  vec<2,_float,_(glm::qualifier)0> local_40;
  vec<2,_float,_(glm::qualifier)0> local_38;
  vec<2,_float,_(glm::qualifier)0> local_30;
  vec<2,_float,_(glm::qualifier)0> local_28;
  vec<2,_float,_(glm::qualifier)0> local_20;
  
  if (shapeHAlign == 4) {
    _x = _x - _w;
  }
  else if (shapeHAlign == 2) {
    _x = _x + _w * -0.5;
  }
  if (shapeVAlign == 0x20) {
    _y = _y - _h;
  }
  else if (shapeVAlign == 0x10) {
    _y = _y + _h * -0.5;
  }
  _local_48 = (vec<2,_float,_(glm::qualifier)0>)CONCAT44(_y,_x);
  local_40.field_1.y = _y;
  local_40.field_0.x = _w + _x;
  local_38.field_1.y = _h + _y;
  local_38.field_0.x = _w + _x;
  local_30.field_1.y = _h + _y;
  local_30.field_0.x = _x;
  local_28.field_1.y = _y;
  local_28.field_0.x = _x;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_48;
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::vector(&local_60,__l,(allocator_type *)&local_78);
  _local_48 = *local_60.
               super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  local_40 = local_60.
             super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1];
  local_38 = local_60.
             super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[2];
  local_30 = local_60.
             super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[2];
  local_28 = local_60.
             super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[3];
  local_20 = *local_60.
              super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  __l_00._M_len = 6;
  __l_00._M_array = (iterator)&local_48;
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::vector(&local_78,__l_00,&local_79);
  if (_program == (Shader *)0x0) {
    if (fill_enabled == '\x01') {
      triangles(&local_78,(Shader *)0x0);
    }
    if (stroke_enabled == '\x01') {
      line(&local_60,(Shader *)0x0);
    }
  }
  else {
    triangles(&local_78,_program);
  }
  if (local_78.
      super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60.
      super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void rect(float _x, float _y, float _w, float _h, Shader* _program) {
    if (shapeHAlign == ALIGN_CENTER)
        _x -= _w * 0.5f;
    else if (shapeHAlign == ALIGN_RIGHT)
        _x -= _w;
    
    if (shapeVAlign == ALIGN_MIDDLE)
        _y -= _h * 0.5f;
    else if (shapeVAlign == ALIGN_BOTTOM)
        _y -= _h;

    std::vector<glm::vec2> coorners = { glm::vec2(_x, _y),     glm::vec2(_x + _w, _y), 
                                        glm::vec2(_x + _w, _y + _h), glm::vec2(_x, _y + _h),
                                        glm::vec2(_x, _y) };

    std::vector<glm::vec2> tris = {     coorners[0], coorners[1], coorners[2],
                                        coorners[2], coorners[3], coorners[0] };

    if (_program == nullptr) {
        if (fill_enabled) triangles(tris);
        if (stroke_enabled) line(coorners);
    }
    else
        triangles(tris, _program);
}